

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O0

int QTlsPrivate::X509CertificateOpenSSL::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ulong uVar1;
  long in_FS_OFFSET;
  QList<QSslCertificate> roots;
  int iVar2;
  EVP_PKEY_CTX *this;
  QSslConfiguration local_28;
  uchar local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20[0] = 0xaa;
  local_20[1] = 0xaa;
  local_20[2] = 0xaa;
  local_20[3] = 0xaa;
  local_20[4] = 0xaa;
  local_20[5] = 0xaa;
  local_20[6] = 0xaa;
  local_20[7] = 0xaa;
  local_20[8] = 0xaa;
  local_20[9] = 0xaa;
  local_20[10] = 0xaa;
  local_20[0xb] = 0xaa;
  local_20[0xc] = 0xaa;
  local_20[0xd] = 0xaa;
  local_20[0xe] = 0xaa;
  local_20[0xf] = 0xaa;
  local_20[0x10] = 0xaa;
  local_20[0x11] = 0xaa;
  local_20[0x12] = 0xaa;
  local_20[0x13] = 0xaa;
  local_20[0x14] = 0xaa;
  local_20[0x15] = 0xaa;
  local_20[0x16] = 0xaa;
  local_20[0x17] = 0xaa;
  this = ctx;
  QSslConfiguration::defaultConfiguration();
  QSslConfiguration::caCertificates();
  QSslConfiguration::~QSslConfiguration(&local_28);
  uVar1 = QSslSocketPrivate::rootCertOnDemandLoadingSupported();
  if ((uVar1 & 1) != 0) {
    QSslSocketPrivate::systemCaCertificates();
    QList<QSslCertificate>::append((QList<QSslCertificate> *)this,(QList<QSslCertificate> *)ctx);
    QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x1394b7);
  }
  iVar2 = (int)this;
  verify(ctx,local_20,(size_t)sig,(uchar *)siglen,tbslen);
  QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x1394df);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

QList<QSslError> X509CertificateOpenSSL::verify(const QList<QSslCertificate> &chain,
                                                const QString &hostName)
{
    // This was previously QSslSocketPrivate::verify().
    auto roots = QSslConfiguration::defaultConfiguration().caCertificates();
#ifndef Q_OS_WIN
    // On Windows, system CA certificates are already set as default ones.
    // No need to add them again (and again) and also, if the default configuration
    // has its own set of CAs, this probably should not be amended by the ones
    // from the 'ROOT' store, since it's not what an application chose to trust.
    if (QSslSocketPrivate::rootCertOnDemandLoadingSupported())
        roots.append(QSslSocketPrivate::systemCaCertificates());
#endif // Q_OS_WIN
    return verify(roots, chain, hostName);
}